

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_compound_stmt(gvisitor_t *self,gnode_compound_stmt_t *node)

{
  long *plVar1;
  gnode_t *node_00;
  size_t sVar2;
  size_t _i;
  ulong uVar3;
  
  if (node->stmts == (gnode_r *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = node->stmts->n;
  }
  for (uVar3 = 0; sVar2 != uVar3; uVar3 = uVar3 + 1) {
    if (uVar3 < node->stmts->n) {
      node_00 = node->stmts->p[uVar3];
    }
    else {
      node_00 = (gnode_t *)0x0;
    }
    gvisit(self,node_00);
    plVar1 = *(long **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
    if ((gravity_class_t *)*plVar1 == gravity_class_function) {
      ircode_register_temps_clear((ircode_t *)plVar1[0x14]);
    }
  }
  if (node->nclose != 0xffffffff) {
    plVar1 = *(long **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
    if ((plVar1 != (long *)0x0) && ((gravity_class_t *)*plVar1 == gravity_class_function)) {
      ircode_add((ircode_t *)plVar1[0x14],CLOSE,node->nclose,0,0,(node->base).token.lineno);
      return;
    }
    report_error(self,&node->base,"Invalid code context.");
    return;
  }
  return;
}

Assistant:

static void visit_compound_stmt (gvisitor_t *self, gnode_compound_stmt_t *node) {
    DEBUG_CODEGEN("visit_compound_stmt");

    gnode_array_each(node->stmts, {
        visit(val);

        // check if context is a function
        DECLARE_CONTEXT();
        bool is_func_ctx = OBJECT_ISA_FUNCTION(context_object);
        if (!is_func_ctx) continue;

        // in case of function context cleanup temporary registers
        gravity_function_t *f = (gravity_function_t*)context_object;
        ircode_t *code = (ircode_t *)f->bytecode;
        ircode_register_temps_clear(code);
    });

    if (node->nclose != UINT32_MAX) {
        DECLARE_CODE();
		ircode_add(code, CLOSE, node->nclose, 0, 0, LINE_NUMBER(node));
    }
}